

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O3

double __thiscall
helics::RandomDropFilterOperation::getProperty(RandomDropFilterOperation *this,string_view property)

{
  if (property._M_len == 4) {
    if ((int)*(long *)property._M_str == 0x626f7270) goto LAB_00269380;
  }
  else if ((property._M_len == 8) && (*(long *)property._M_str == 0x626f7270706f7264)) {
LAB_00269380:
    return (this->dropProb).super___atomic_float<double>._M_fp;
  }
  return -1e+49;
}

Assistant:

double RandomDropFilterOperation::getProperty(std::string_view property)
{
    if ((property == "dropprob") || (property == "prob")) {
        return dropProb.load();
    }
    return FilterOperations::getProperty(property);
}